

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv4transmitter.cpp
# Opt level: O0

void __thiscall jrtplib::RTPUDPv4Transmitter::ClearAcceptIgnoreInfo(RTPUDPv4Transmitter *this)

{
  PortInfo *obj;
  bool bVar1;
  PortInfo **ppPVar2;
  RTPMemoryManager *mgr;
  PortInfo *inf;
  RTPUDPv4Transmitter *this_local;
  
  RTPKeyHashTable<const_unsigned_int,_jrtplib::RTPUDPv4Transmitter::PortInfo_*,_jrtplib::RTPUDPv4Trans_GetHashIndex_uint32_t,_8317>
  ::GotoFirstElement(&this->acceptignoreinfo);
  while( true ) {
    bVar1 = RTPKeyHashTable<const_unsigned_int,_jrtplib::RTPUDPv4Transmitter::PortInfo_*,_jrtplib::RTPUDPv4Trans_GetHashIndex_uint32_t,_8317>
            ::HasCurrentElement(&this->acceptignoreinfo);
    if (!bVar1) break;
    ppPVar2 = RTPKeyHashTable<const_unsigned_int,_jrtplib::RTPUDPv4Transmitter::PortInfo_*,_jrtplib::RTPUDPv4Trans_GetHashIndex_uint32_t,_8317>
              ::GetCurrentElement(&this->acceptignoreinfo);
    obj = *ppPVar2;
    mgr = RTPMemoryObject::GetMemoryManager((RTPMemoryObject *)this);
    RTPDelete<jrtplib::RTPUDPv4Transmitter::PortInfo>(obj,mgr);
    RTPKeyHashTable<const_unsigned_int,_jrtplib::RTPUDPv4Transmitter::PortInfo_*,_jrtplib::RTPUDPv4Trans_GetHashIndex_uint32_t,_8317>
    ::GotoNextElement(&this->acceptignoreinfo);
  }
  RTPKeyHashTable<const_unsigned_int,_jrtplib::RTPUDPv4Transmitter::PortInfo_*,_jrtplib::RTPUDPv4Trans_GetHashIndex_uint32_t,_8317>
  ::Clear(&this->acceptignoreinfo);
  return;
}

Assistant:

void RTPUDPv4Transmitter::ClearAcceptIgnoreInfo()
{
	acceptignoreinfo.GotoFirstElement();
	while (acceptignoreinfo.HasCurrentElement())
	{
		PortInfo *inf;

		inf = acceptignoreinfo.GetCurrentElement();
		RTPDelete(inf,GetMemoryManager());
		acceptignoreinfo.GotoNextElement();
	}
	acceptignoreinfo.Clear();
}